

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O1

void destroy_drawbridge(int x,int y)

{
  undefined1 *puVar1;
  char cVar2;
  level *plVar3;
  schar sVar4;
  boolean bVar5;
  obj *obj;
  trap *ptVar6;
  schar sVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  char *line;
  char *pcVar11;
  int iVar12;
  
  plVar3 = level;
  cVar2 = level->locations[x][y].typ;
  if ((cVar2 != '$') && (cVar2 != '\x14')) {
    return;
  }
  iVar12 = y;
  iVar10 = x;
  switch(*(uint *)&level->locations[x][y].field_0x6 >> 4 & 3) {
  case 0:
    iVar12 = y + -1;
    break;
  case 1:
    iVar12 = y + 1;
    break;
  case 2:
    iVar10 = x + 1;
    break;
  case 3:
    iVar10 = x + -1;
  }
  uVar9 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1c;
  if (uVar9 == 0x10) {
LAB_0015e8bf:
    uVar9 = 2 - (uVar9 == 0);
LAB_0015e8e1:
    if (cVar2 == '\x14') {
      if ((viz_array[iVar12][iVar10] & 2U) != 0) {
        pcVar11 = destroy_drawbridge::wstr[uVar9];
        line = "The portcullis of the drawbridge falls into the %s!";
        goto LAB_0015e978;
      }
LAB_0015e91b:
      if (flags.soundok != '\0') {
        You_hear("a loud *SPLASH*!");
      }
    }
    else {
      if ((viz_array[y][x] & 2U) == 0) goto LAB_0015e91b;
      pcVar11 = destroy_drawbridge::wstr[uVar9];
      line = "The drawbridge collapses into the %s!";
LAB_0015e978:
      pline(line,pcVar11);
    }
    sVar7 = '#';
    if (uVar9 == 1) {
      sVar7 = '\x12';
    }
    sVar4 = '\x15';
    if (uVar9 != 0) {
      sVar4 = sVar7;
    }
    plVar3->locations[x][y].typ = sVar4;
    puVar1 = &plVar3->locations[x][y].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
    obj = sobj_at(0x214,level,x,y);
    if (obj != (obj *)0x0) {
      obj_extract_self(obj);
      flooreffects(obj,x,y,"fall");
    }
  }
  else {
    if (uVar9 == 4) {
      uVar9 = 0;
      goto LAB_0015e8e1;
    }
    if (uVar9 == 0) goto LAB_0015e8bf;
    if ((viz_array[y][x] & 2U) == 0) {
      You_hear("a loud *CRASH*!");
    }
    else {
      pline("The drawbridge disintegrates!");
    }
    uVar9 = *(uint *)&plVar3->locations[x][y].field_0x6;
    plVar3->locations[x][y].typ = ((char)uVar9 < '\0') * '\t' + '\x19';
    *(uint *)&plVar3->locations[x][y].field_0x6 = (uVar9 & 0xfffffe0f) + (uVar9 & 0x80) * 2;
  }
  wake_nearto(x,y,500);
  plVar3->locations[iVar10][iVar12].typ = '\x17';
  puVar1 = &plVar3->locations[iVar10][iVar12].field_0x6;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
  ptVar6 = t_at(level,x,y);
  if (ptVar6 != (trap *)0x0) {
    deltrap(level,ptVar6);
  }
  ptVar6 = t_at(level,iVar10,iVar12);
  if (ptVar6 != (trap *)0x0) {
    deltrap(level,ptVar6);
  }
  newsym(x,y);
  newsym(iVar10,iVar12);
  bVar5 = does_block(level,iVar10,iVar12,(monst *)0x0);
  if (bVar5 == '\0') {
    unblock_point(iVar10,iVar12);
  }
  bVar5 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
  if (bVar5 != '\0') {
    u.uevent._1_1_ = u.uevent._1_1_ | 1;
  }
  set_entity(iVar10,iVar12,occupants + 1);
  if (occupants[1].edata != (permonst *)0x0) {
    if (occupants[1].emon == &youmonst) {
      bVar8 = 0;
    }
    else if ((occupants[1].emon)->wormno == '\0') {
      if (((viz_array[(occupants[1].emon)->my][(occupants[1].emon)->mx] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((bVar8 = 1, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
            (bVar8 = 1, ((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          ((bVar8 = 1, (viz_array[(occupants[1].emon)->my][(occupants[1].emon)->mx] & 1U) != 0 &&
           (((occupants[1].emon)->data->mflags3 & 0x200) != 0)))))) goto LAB_0015ebe7;
    }
    else {
      bVar5 = worm_known(level,occupants[1].emon);
      if (bVar5 == '\0') {
        bVar8 = 1;
      }
      else {
LAB_0015ebe7:
        uVar9 = *(uint *)&(occupants[1].emon)->field_0x60;
        if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          bVar8 = 1;
          if (-1 < (char)uVar9) goto LAB_0015ec30;
        }
        else {
          bVar8 = 1;
          if ((-1 < (char)uVar9) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0015ec30:
            bVar8 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar9 >> 9) & 1;
          }
        }
      }
    }
    bVar5 = automiss(occupants + 1);
    if (bVar5 == '\0') {
      iVar10 = 2;
      if (bVar8 == 0) {
        E_phrase(occupants + 1,"are");
        pline("%s blown apart by flying debris.",E_phrase::wholebuf);
        iVar10 = 3;
      }
      killer_format = 0;
      killer = "exploding drawbridge";
      e_died(occupants + 1,iVar10,7);
    }
  }
  set_entity(x,y,occupants);
  if (occupants[0].edata == (permonst *)0x0) {
    return;
  }
  if (occupants[0].emon == &youmonst) {
    bVar8 = 0;
  }
  else {
    if ((occupants[0].emon)->wormno == '\0') {
      if (((viz_array[(occupants[0].emon)->my][(occupants[0].emon)->mx] & 2U) == 0) &&
         (((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
            || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
           ((bVar8 = 1, ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
          (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
            (bVar8 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
           ((bVar8 = 1, (viz_array[(occupants[0].emon)->my][(occupants[0].emon)->mx] & 1U) == 0 ||
            (((occupants[0].emon)->data->mflags3 & 0x200) == 0)))))))) goto LAB_0015ee29;
    }
    else {
      bVar5 = worm_known(level,occupants[0].emon);
      if (bVar5 == '\0') {
        bVar8 = 1;
        goto LAB_0015ee29;
      }
    }
    uVar9 = *(uint *)&(occupants[0].emon)->field_0x60;
    if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      bVar8 = 1;
      if ((char)uVar9 < '\0') goto LAB_0015ee29;
    }
    else {
      bVar8 = 1;
      if (((char)uVar9 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_0015ee29;
    }
    bVar8 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar9 >> 9) & 1;
  }
LAB_0015ee29:
  bVar5 = e_missed(occupants,'\x01');
  if (bVar5 != '\0') {
    return;
  }
  if (bVar8 == 0) {
    if (((occupants[0].emon == &youmonst) || (u.uprops[0x23].intrinsic == 0)) ||
       ((u.uprops[0x24].extrinsic != 0 ||
        ((u.umonnum != u.umonster && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')))))) {
      E_phrase(occupants,"are");
      pcVar11 = "%s hit by a huge chunk of metal!";
    }
    else {
      E_phrase(occupants,"get");
      pcVar11 = "%s into some heavy metal!";
    }
    pline(pcVar11,E_phrase::wholebuf);
    iVar10 = 3;
  }
  else {
    iVar10 = 2;
    if (((flags.soundok != '\0') && (occupants[0].emon != &youmonst)) &&
       ((0x14 < (uint)y || 0x4e < x - 1U ||
        ((cVar2 = level->locations[(uint)x][(uint)y].typ, 2 < (byte)(cVar2 - 0x11U) &&
         ((cVar2 != '\x14' ||
          ((*(ushort *)&level->locations[(uint)x][(uint)y].field_0x6 & 0x1c0) != 0)))))))) {
      You_hear("a crushing sound.");
    }
  }
  killer_format = 0;
  killer = "collapsing drawbridge";
  e_died(occupants,iVar10,7);
  if (plVar3->locations[x][y].typ != '\x12') {
    return;
  }
  do_entity(occupants);
  return;
}

Assistant:

void destroy_drawbridge(int x, int y)
{
	struct rm *loc1, *loc2;
	struct trap *t;
	int x2, y2;
	int db_u;
	boolean e_inview;
	struct entity *etmp1 = &(occupants[0]), *etmp2 = &(occupants[1]);

	loc1 = &level->locations[x][y];
	if (!IS_DRAWBRIDGE(loc1->typ))
		return;
	x2 = x; y2 = y;
	get_wall_for_db(&x2,&y2);
	loc2 = &level->locations[x2][y2];
	db_u = (loc1->drawbridgemask & DB_UNDER);
	if (db_u == DB_MOAT || db_u == DB_LAVA || db_u == DB_BOG) {
		struct obj *otmp;
		int where = (db_u == DB_LAVA) ? 0 :
			    (db_u == DB_MOAT) ? 1 : 2;
		static char *wstr[3] = { "lava", "moat", "swamp" };
		if (loc1->typ == DRAWBRIDGE_UP) {
			if (cansee(x2,y2))
			    pline("The portcullis of the drawbridge falls into the %s!",
				  wstr[where]);
			else if (flags.soundok)
				You_hear("a loud *SPLASH*!");
		} else {
			if (cansee(x,y))
			    pline("The drawbridge collapses into the %s!",
				  wstr[where]);
			else if (flags.soundok)
				You_hear("a loud *SPLASH*!");
		}
		loc1->typ = (where == 0) ? LAVAPOOL :
			    (where == 1) ? MOAT : BOG;
		loc1->drawbridgemask = 0;
		if ((otmp = sobj_at(BOULDER, level, x,y)) != 0) {
		    obj_extract_self(otmp);
		    flooreffects(otmp,x,y,"fall");
		}
	} else {
		if (cansee(x,y))
			pline("The drawbridge disintegrates!");
		else
			You_hear("a loud *CRASH*!");
		loc1->typ =
			((loc1->drawbridgemask & DB_ICE) ? ICE : ROOM);
		loc1->icedpool =
			((loc1->drawbridgemask & DB_ICE) ? ICED_MOAT : 0);
	}
	wake_nearto(x, y, 500);
	loc2->typ = DOOR;
	loc2->doormask = D_NODOOR;
	if ((t = t_at(level, x, y)) != 0) deltrap(level, t);
	if ((t = t_at(level, x2, y2)) != 0) deltrap(level, t);
	newsym(x,y);
	newsym(x2,y2);
	if (!does_block(level, x2, y2, NULL)) unblock_point(x2,y2); /* vision */
	if (Is_stronghold(&u.uz)) u.uevent.uopened_dbridge = TRUE;

	set_entity(x2, y2, etmp2); /* currently only automissers can be here */
	if (etmp2->edata) {
		e_inview = e_canseemon(level, etmp2);
		if (!automiss(etmp2)) {
			if (e_inview)
				pline("%s blown apart by flying debris.",
				      E_phrase(etmp2, "are"));
			killer_format = KILLED_BY_AN;
			killer = "exploding drawbridge";
			e_died(etmp2, e_inview? 3 : 2, CRUSHING); /*no corpse*/
		}	     /* nothing which is vulnerable can survive this */
	}
	set_entity(x, y, etmp1);
	if (etmp1->edata) {
		e_inview = e_canseemon(level, etmp1);
		if (!e_missed(etmp1, TRUE)) {
			if (e_inview) {
			    if (!is_u(etmp1) && Hallucination)
				pline("%s into some heavy metal!",
				      E_phrase(etmp1, "get"));
			    else
				pline("%s hit by a huge chunk of metal!",
				      E_phrase(etmp1, "are"));
			} else {
			    if (flags.soundok && !is_u(etmp1) && !is_pool(level, x,y))
				You_hear("a crushing sound.");
			}
			killer_format = KILLED_BY_AN;
			killer = "collapsing drawbridge";
			e_died(etmp1, e_inview? 3 : 2, CRUSHING); /*no corpse*/
			if (loc1->typ == MOAT) do_entity(etmp1);
		}
	}
}